

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-vec1.c
# Opt level: O3

void mul_mat_vec_f16_0(uint16_t *src0,uint16_t *src1,float *dst,int nrows,int ncols)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (0 < nrows) {
    uVar8 = ncols & 0xfffffff8;
    uVar9 = 0;
    do {
      auVar10 = ZEXT816(0) << 0x40;
      if (0 < (int)uVar8) {
        lVar7 = 0;
        do {
          auVar3 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src0 + lVar7));
          auVar4 = vcvtph2ps_f16c(*(undefined1 (*) [16])(src1 + lVar7));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar3,auVar4);
          lVar7 = lVar7 + 8;
        } while (lVar7 < (int)uVar8);
      }
      auVar11._0_4_ = auVar10._0_4_ + 0.0;
      auVar11._4_4_ = auVar10._4_4_ + 0.0;
      auVar11._8_4_ = auVar10._8_4_ + 0.0;
      auVar11._12_4_ = auVar10._12_4_ + 0.0;
      auVar10 = vshufpd_avx(auVar11,auVar11,1);
      auVar12._0_4_ = auVar11._0_4_ + auVar10._0_4_;
      auVar12._4_4_ = auVar11._4_4_ + auVar10._4_4_;
      auVar12._8_4_ = auVar11._8_4_ + auVar10._8_4_;
      auVar12._12_4_ = auVar11._12_4_ + auVar10._12_4_;
      auVar10 = vhaddps_avx(auVar12,auVar12);
      dst[uVar9] = auVar10._0_4_;
      lVar7 = (long)(int)uVar8;
      if (uVar8 != ncols) {
        do {
          uVar6 = (uint)(short)src0[lVar7];
          if (uVar6 << 0x11 < 0x8000000) {
            fVar1 = (float)(uVar6 & 0x7fff | 0x3f000000) + -0.5;
          }
          else {
            fVar1 = (float)((uVar6 << 0x11) >> 4 | 0x70000000) * 1.92593e-34;
          }
          uVar5 = (uint)(short)src1[lVar7];
          if (uVar5 << 0x11 < 0x8000000) {
            fVar2 = (float)(uVar5 & 0x7fff | 0x3f000000) + -0.5;
          }
          else {
            fVar2 = (float)((uVar5 << 0x11) >> 4 | 0x70000000) * 1.92593e-34;
          }
          auVar11 = vorps_avx(ZEXT416((uint)fVar1),ZEXT416(uVar6 & 0x80000000));
          auVar12 = vorps_avx(ZEXT416((uint)fVar2),ZEXT416(uVar5 & 0x80000000));
          auVar10 = vfmadd231ss_fma(auVar10,auVar11,auVar12);
          lVar7 = lVar7 + 1;
        } while (lVar7 < ncols);
        dst[uVar9] = auVar10._0_4_;
      }
      uVar9 = uVar9 + 1;
      src0 = src0 + ncols;
    } while (uVar9 != (uint)nrows);
  }
  return;
}

Assistant:

void mul_mat_vec_f16_0(
    const uint16_t * src0,
    const uint16_t * src1,
             float * dst,
    int nrows,
    int ncols) {

    const int ncols8 = ncols & ~7;

    for (int i = 0; i < nrows; i++) {
        __m256 sum = _mm256_setzero_ps();

        const uint16_t * src0_row = src0 + i * ncols;
        for (int j = 0; j < ncols8; j += 8) {
            __m256 a = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src0_row + j)));
            __m256 b = _mm256_cvtph_ps(_mm_loadu_si128((__m128i*)(src1 + j)));
#if defined(__FMA__)
            sum = _mm256_fmadd_ps(a, b, sum);
#else
            sum = _mm256_add_ps(_mm256_mul_ps(a, b), sum);
#endif
        }
        dst[i] = reduce_vector8_0(sum);

        for (int j = ncols8; j < ncols; j++) {
            dst[i] += fp16_ieee_to_fp32_value(src0_row[j]) * fp16_ieee_to_fp32_value(src1[j]);
        }
    }
}